

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  agc_t *agc;
  gauden_t *pgVar5;
  vector_t *ppfVar6;
  vector_t pfVar7;
  bool bVar8;
  model_def_t *mdef_00;
  cmn_type_t cmn;
  agc_type_t agc_00;
  int32 iVar9;
  int iVar10;
  uint32 uVar11;
  cmd_ln_t *pcVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  feat_t *feat;
  int32 **subvecs;
  char *pcVar17;
  char *pcVar18;
  char *base;
  uint32 *puVar19;
  vector_t ***ppppfVar20;
  lexicon_t *prior_lex;
  FILE *__stream;
  cmn_t *pcVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  gauden_t *g;
  ulong uVar25;
  model_def_t *mdef_01;
  double dVar26;
  char *local_10a0;
  model_def_t *mdef;
  uint32 n_mllr;
  uint32 n_cb;
  uint32 n_ts;
  uint32 tmp_n_stream;
  char *local_1080;
  long local_1078;
  uint32 n_map;
  int32 *mllr_idx;
  char *local_1060;
  float32 ***sxfrm_b;
  float32 ****sxfrm_a;
  long local_1048;
  uint32 tmp_n_mllrcls;
  char fn [4097];
  
  mllr_idx = (int32 *)0x0;
  sxfrm_a = (float32 ****)0x0;
  sxfrm_b = (float32 ***)0x0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
          ,0xc9,"Compiled on %s at %s\n","Apr 26 2025","20:11:01");
  train_cmd_ln_parse(argc,argv);
  pcVar12 = cmd_ln_get();
  pcVar13 = cmd_ln_str_r(pcVar12,"-feat");
  pcVar12 = cmd_ln_get();
  pcVar14 = cmd_ln_str_r(pcVar12,"-cmn");
  cmn = cmn_type_from_str(pcVar14);
  pcVar12 = cmd_ln_get();
  lVar15 = cmd_ln_int_r(pcVar12,"-varnorm");
  pcVar12 = cmd_ln_get();
  pcVar14 = cmd_ln_str_r(pcVar12,"-agc");
  agc_00 = agc_type_from_str(pcVar14);
  pcVar12 = cmd_ln_get();
  lVar16 = cmd_ln_int_r(pcVar12,"-ceplen");
  feat = feat_init(pcVar13,cmn,(uint)(lVar15 != 0),agc_00,1,(int32)lVar16);
  pcVar12 = cmd_ln_get();
  pcVar13 = cmd_ln_str_r(pcVar12,"-lda");
  if (pcVar13 == (char *)0x0) {
LAB_0010b391:
    pcVar12 = cmd_ln_get();
    pcVar13 = cmd_ln_str_r(pcVar12,"-svspec");
    if (pcVar13 != (char *)0x0) {
      pcVar12 = cmd_ln_get();
      pcVar13 = "-svspec";
      pcVar14 = cmd_ln_str_r(pcVar12,"-svspec");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0xe3,"Using subvector specification %s\n",pcVar14);
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-svspec");
      subvecs = parse_subvecs(pcVar14);
      if (subvecs == (int32 **)0x0) goto LAB_0010b73e;
      iVar10 = feat_set_subvecs(feat,subvecs);
      if (-1 < iVar10) goto LAB_0010b41a;
      prior_lex = (lexicon_t *)0x0;
      mdef_01 = (model_def_t *)0x0;
      goto LAB_0010b8dc;
    }
LAB_0010b41a:
    pcVar12 = cmd_ln_get();
    iVar10 = cmd_ln_exists_r(pcVar12,"-agcthresh");
    if (iVar10 != 0) {
      pcVar12 = cmd_ln_get();
      pcVar13 = cmd_ln_str_r(pcVar12,"-agc");
      iVar10 = strcmp(pcVar13,"none");
      if (iVar10 != 0) {
        agc = feat->agc_struct;
        pcVar12 = cmd_ln_get();
        dVar26 = cmd_ln_float_r(pcVar12,"-agcthresh");
        agc_set_threshold(agc,(float32)(float)dVar26);
      }
    }
    if (feat->cmn_struct != (cmn_t *)0x0) {
      pcVar12 = cmd_ln_get();
      iVar10 = cmd_ln_exists_r(pcVar12,"-cmninit");
      if (iVar10 != 0) {
        pcVar12 = cmd_ln_get();
        pcVar13 = cmd_ln_str_r(pcVar12,"-cmninit");
        pcVar13 = __ckd_salloc__(pcVar13,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                 ,0xf5);
        pcVar21 = feat->cmn_struct;
        bVar8 = 0 < pcVar21->veclen;
        if (0 < pcVar21->veclen) {
          pcVar17 = strchr(pcVar13,0x2c);
          pcVar14 = pcVar13;
          if (pcVar17 == (char *)0x0) {
            lVar15 = 0;
          }
          else {
            lVar15 = 0;
            do {
              *pcVar17 = '\0';
              dVar26 = atof(pcVar14);
              pcVar21 = feat->cmn_struct;
              pcVar21->cmn_mean[lVar15] = (mfcc_t)(float)dVar26;
              lVar15 = lVar15 + 1;
              bVar8 = lVar15 < pcVar21->veclen;
              if (pcVar21->veclen <= lVar15) goto LAB_0010b580;
              pcVar14 = pcVar17 + 1;
              pcVar17 = strchr(pcVar14,0x2c);
            } while (pcVar17 != (char *)0x0);
          }
          if ((bVar8) && (*pcVar14 != '\0')) {
            dVar26 = atof(pcVar14);
            pcVar21->cmn_mean[lVar15] = (mfcc_t)(float)dVar26;
          }
        }
LAB_0010b580:
        ckd_free(pcVar13);
      }
    }
    pcVar13 = (char *)mod_inv_new();
    uVar11 = feat->n_sv;
    if (uVar11 == 0) {
      uVar11 = feat->n_stream;
    }
    mod_inv_set_n_feat((model_inventory_t *)pcVar13,uVar11);
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-moddeffn");
    pcVar12 = cmd_ln_get();
    local_10a0 = cmd_ln_str_r(pcVar12,"-meanfn");
    pcVar12 = cmd_ln_get();
    local_1080 = cmd_ln_str_r(pcVar12,"-varfn");
    pcVar12 = cmd_ln_get();
    pcVar17 = cmd_ln_str_r(pcVar12,"-mixwfn");
    pcVar12 = cmd_ln_get();
    pcVar18 = cmd_ln_str_r(pcVar12,"-tmatfn");
    pcVar12 = cmd_ln_get();
    local_1060 = cmd_ln_str_r(pcVar12,"-fdictfn");
    pcVar12 = cmd_ln_get();
    base = cmd_ln_str_r(pcVar12,"-hmmdir");
    if (base != (char *)0x0) {
      if (pcVar14 == (char *)0x0) {
        pcVar14 = string_join(base,"/mdef",0);
      }
      if (local_10a0 == (char *)0x0) {
        local_10a0 = string_join(base,"/means",0);
      }
      if (local_1080 == (char *)0x0) {
        local_1080 = string_join(base,"/variances",0);
      }
      if (pcVar17 == (char *)0x0) {
        pcVar17 = string_join(base,"/mixture_weights",0);
      }
      if (pcVar18 == (char *)0x0) {
        pcVar18 = string_join(base,"/transition_matrices",0);
      }
      if (local_1060 == (char *)0x0) {
        local_1060 = string_join(base,"/noisedict",0);
      }
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x122,"Reading %s\n",pcVar14);
    iVar9 = model_def_read(&mdef,pcVar14);
    mdef_01 = mdef;
    if (iVar9 != 0) goto LAB_0010b73e;
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-ts2cbfn");
    if (pcVar14 == (char *)0x0) {
      pcVar13 = "Specify -ts2cbfn\n";
      lVar15 = 0x12f;
      goto LAB_0010c387;
    }
    iVar10 = strcmp(pcVar14,".semi.");
    if (iVar10 != 0) {
      iVar10 = strcmp(pcVar14,".cont.");
      if (iVar10 == 0) {
        puVar19 = cont_ts2cb(mdef->n_tied_state);
        mdef->cb = puVar19;
        n_cb = mdef->n_tied_state;
        n_ts = n_cb;
        goto LAB_0010b834;
      }
      iVar10 = strcmp(pcVar14,".ptm.");
      if (iVar10 == 0) {
        puVar19 = ptm_ts2cb(mdef);
        mdef->cb = puVar19;
        n_ts = mdef->n_tied_state;
        n_cb = mdef->acmod_set->n_ci;
        goto LAB_0010b834;
      }
      iVar10 = s3ts2cb_read(pcVar14,&mdef->cb,&n_ts,&n_cb);
      if (iVar10 == 0) goto LAB_0010b834;
LAB_0010b8d9:
      prior_lex = (lexicon_t *)0x0;
LAB_0010b8dc:
      bVar8 = false;
      goto LAB_0010b8df;
    }
    puVar19 = semi_ts2cb(mdef->n_tied_state);
    mdef->cb = puVar19;
    n_ts = mdef->n_tied_state;
    n_cb = 1;
LAB_0010b834:
    mdef_00 = mdef;
    ((model_inventory_t *)pcVar13)->acmod_set = mdef->acmod_set;
    ((model_inventory_t *)pcVar13)->mdef = mdef;
    pcVar12 = cmd_ln_get();
    dVar26 = cmd_ln_float_r(pcVar12,"-mwfloor");
    iVar9 = mod_inv_read_mixw((model_inventory_t *)pcVar13,mdef_00,pcVar17,(float32)(float)dVar26);
    if (iVar9 != 0) goto LAB_0010b8d9;
    if (n_ts != ((model_inventory_t *)pcVar13)->n_mixw) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x150,"%u mappings from tied-state to cb, but %u tied-state in %s\n",
              (ulong)mdef->n_cb,(ulong)((model_inventory_t *)pcVar13)->n_mixw,pcVar17);
    }
    pcVar12 = cmd_ln_get();
    dVar26 = cmd_ln_float_r(pcVar12,"-tpfloor");
    iVar9 = mod_inv_read_tmat((model_inventory_t *)pcVar13,pcVar18,(float32)(float)dVar26);
    if (iVar9 != 0) goto LAB_0010b8d9;
    pcVar12 = cmd_ln_get();
    dVar26 = cmd_ln_float_r(pcVar12,"-varfloor");
    local_1078 = CONCAT44(local_1078._4_4_,(float)dVar26);
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-topn");
    pcVar12 = cmd_ln_get();
    lVar16 = cmd_ln_int_r(pcVar12,"-fullvar");
    iVar9 = mod_inv_read_gauden((model_inventory_t *)pcVar13,local_10a0,local_1080,
                                (float32)local_1078,(uint32)lVar15,(int32)lVar16);
    if (iVar9 != 0) {
      pcVar12 = cmd_ln_get();
      lVar15 = cmd_ln_int_r(pcVar12,"-fullvar");
      if ((int)lVar15 == 0) goto LAB_0010b8d9;
      pcVar12 = cmd_ln_get();
      dVar26 = cmd_ln_float_r(pcVar12,"-varfloor");
      local_1078 = CONCAT44(local_1078._4_4_,(float)dVar26);
      pcVar12 = cmd_ln_get();
      lVar15 = cmd_ln_int_r(pcVar12,"-topn");
      prior_lex = (lexicon_t *)0x0;
      iVar9 = mod_inv_read_gauden((model_inventory_t *)pcVar13,local_10a0,local_1080,
                                  (float32)local_1078,(uint32)lVar15,0);
      if (iVar9 != 0) goto LAB_0010b8dc;
    }
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-diagfull");
    if (((int)lVar15 != 0) &&
       (pgVar5 = ((model_inventory_t *)pcVar13)->gauden, pgVar5->var == (vector_t ***)0x0)) {
      ppppfVar20 = gauden_alloc_param(pgVar5->n_mgau,pgVar5->n_feat,pgVar5->n_density,pgVar5->veclen
                                     );
      pgVar5->var = ppppfVar20;
      uVar1 = pgVar5->n_mgau;
      if ((ulong)uVar1 != 0) {
        uVar2 = pgVar5->n_feat;
        uVar22 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            uVar3 = pgVar5->n_density;
            uVar23 = 0;
            do {
              if ((ulong)uVar3 != 0) {
                uVar4 = pgVar5->veclen[uVar23];
                uVar24 = 0;
                do {
                  if ((ulong)uVar4 != 0) {
                    ppfVar6 = pgVar5->fullvar[uVar22][uVar23][uVar24];
                    pfVar7 = ppppfVar20[uVar22][uVar23][uVar24];
                    uVar25 = 0;
                    do {
                      pfVar7[uVar25] = ppfVar6[uVar25][uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar4 != uVar25);
                  }
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar3);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar2);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar1);
      }
      gauden_free_param_full(pgVar5->fullvar);
      pgVar5->fullvar = (vector_t ****)0x0;
      gauden_floor_variance(pgVar5);
    }
    iVar10 = gauden_eval_precomp(((model_inventory_t *)pcVar13)->gauden);
    if (iVar10 != 0) {
      prior_lex = (lexicon_t *)0x0;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x184,"Problems precomputing values used during Gaussian density evaluation\n");
      goto LAB_0010b8dc;
    }
    if (((model_inventory_t *)pcVar13)->gauden->n_mgau != n_cb) {
      prior_lex = (lexicon_t *)0x0;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x189,"# of codebooks in mean/var files, %u, inconsistent with ts2cb mapping %u\n");
      goto LAB_0010b8dc;
    }
    pcVar12 = cmd_ln_get();
    pcVar14 = (char *)cmd_ln_int_r(pcVar12,"-mixwreest");
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-meanreest");
    pcVar12 = cmd_ln_get();
    lVar16 = cmd_ln_int_r(pcVar12,"-varreest");
    pcVar12 = cmd_ln_get();
    local_1048 = cmd_ln_int_r(pcVar12,"-tmatreest");
    pcVar18 = "";
    pcVar17 = "";
    if ((int)pcVar14 == 0) {
      pcVar17 = "NOT ";
    }
    local_1080 = pcVar14;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x193,"Will %sreestimate mixing weights.\n",pcVar17);
    pcVar14 = "";
    if ((int)lVar15 == 0) {
      pcVar14 = "NOT ";
    }
    local_1078 = lVar15;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x195,"Will %sreestimate means.\n",pcVar14);
    local_10a0._0_4_ = (int)lVar16;
    pcVar14 = "";
    if ((int)local_10a0 == 0) {
      pcVar14 = "NOT ";
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x197,"Will %sreestimate variances.\n",pcVar14);
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-mixwreest");
    if (((int)lVar15 != 0) &&
       (iVar9 = mod_inv_alloc_mixw_acc((model_inventory_t *)pcVar13), iVar9 != 0))
    goto LAB_0010b8d9;
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-tmatreest");
    if ((int)lVar15 == 0) {
      pcVar18 = "NOT ";
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x19f,"Will %sreestimate transition matrices\n",pcVar18);
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-tmatreest");
    if (((int)lVar15 != 0) &&
       (iVar9 = mod_inv_alloc_tmat_acc((model_inventory_t *)pcVar13), iVar9 != 0))
    goto LAB_0010b8d9;
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-meanreest");
    if ((int)lVar15 == 0) {
      pcVar12 = cmd_ln_get();
      lVar15 = cmd_ln_int_r(pcVar12,"-varreest");
      if ((int)lVar15 != 0) goto LAB_0010bd56;
    }
    else {
LAB_0010bd56:
      iVar9 = mod_inv_alloc_gauden_acc((model_inventory_t *)pcVar13);
      if (iVar9 != 0) goto LAB_0010b8d9;
    }
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-dictfn");
    bVar8 = false;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x1ac,"Reading main dictionary: %s\n",pcVar14);
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-dictfn");
    prior_lex = lexicon_read((lexicon_t *)0x0,pcVar14,mdef->acmod_set);
    pcVar14 = local_1060;
    if (prior_lex == (lexicon_t *)0x0) {
      prior_lex = (lexicon_t *)0x0;
      goto LAB_0010b8df;
    }
    if (local_1060 != (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x1b6,"Reading filler dictionary: %s\n",local_1060);
      lexicon_read(prior_lex,pcVar14,mdef->acmod_set);
    }
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-cepdir");
    corpus_set_mfcc_dir(pcVar14);
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-cepext");
    corpus_set_mfcc_ext(pcVar14);
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-lsnfn");
    pcVar12 = cmd_ln_get();
    if (pcVar14 == (char *)0x0) {
      pcVar14 = cmd_ln_str_r(pcVar12,"-sentdir");
      corpus_set_sent_dir(pcVar14);
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-sentext");
      corpus_set_sent_ext(pcVar14);
    }
    else {
      pcVar14 = cmd_ln_str_r(pcVar12,"-lsnfn");
      corpus_set_lsn_filename(pcVar14);
    }
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-ctlfn");
    if (pcVar14 != (char *)0x0) {
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-ctlfn");
      corpus_set_ctl_filename(pcVar14);
    }
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-phsegdir");
    if (pcVar14 != (char *)0x0) {
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-phsegdir");
      corpus_set_phseg_dir(pcVar14);
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-phsegext");
      corpus_set_phseg_ext(pcVar14);
    }
    pcVar12 = cmd_ln_get();
    pcVar14 = cmd_ln_str_r(pcVar12,"-accumdir");
    if (pcVar14 == (char *)0x0) {
LAB_0010c022:
      pcVar12 = cmd_ln_get();
      lVar15 = cmd_ln_int_r(pcVar12,"-nskip");
      if ((int)lVar15 != 0) {
        pcVar12 = cmd_ln_get();
        lVar15 = cmd_ln_int_r(pcVar12,"-runlen");
        if ((int)lVar15 != 0) {
          pcVar12 = cmd_ln_get();
          lVar15 = cmd_ln_int_r(pcVar12,"-nskip");
          pcVar12 = cmd_ln_get();
          lVar16 = cmd_ln_int_r(pcVar12,"-runlen");
          corpus_set_interval((uint32)lVar15,(uint32)lVar16);
          goto LAB_0010c18e;
        }
      }
      pcVar12 = cmd_ln_get();
      lVar15 = cmd_ln_int_r(pcVar12,"-part");
      if ((int)lVar15 != 0) {
        pcVar12 = cmd_ln_get();
        lVar15 = cmd_ln_int_r(pcVar12,"-npart");
        if ((int)lVar15 != 0) {
          pcVar12 = cmd_ln_get();
          lVar15 = cmd_ln_int_r(pcVar12,"-part");
          pcVar12 = cmd_ln_get();
          lVar16 = cmd_ln_int_r(pcVar12,"-npart");
          corpus_set_partition((uint32)lVar15,(uint32)lVar16);
        }
      }
LAB_0010c18e:
      corpus_init();
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-mllrmat");
      bVar8 = true;
      if (pcVar14 == (char *)0x0) goto LAB_0010b8df;
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-mllrmat");
      iVar9 = read_reg_mat(pcVar14,(uint32 **)fn,&tmp_n_mllrcls,&tmp_n_stream,&sxfrm_a,&sxfrm_b);
      if (iVar9 != 0) {
        pcVar12 = cmd_ln_get();
        pcVar13 = cmd_ln_str_r(pcVar12,"-mllrmat");
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x216,"Unable to read %s\n",pcVar13);
        goto LAB_0010c393;
      }
      uVar11 = feat->n_sv;
      if (uVar11 == 0) {
        uVar11 = feat->n_stream;
      }
      if (uVar11 == tmp_n_stream) {
        if (feat->lda == (mfcc_t ***)0x0) {
          puVar19 = feat->sv_len;
          if (puVar19 == (uint32 *)0x0) {
            puVar19 = feat->stream_len;
          }
        }
        else {
          puVar19 = &feat->out_dim;
        }
        if ((ulong)tmp_n_stream != 0) {
          uVar22 = 0;
          do {
            uVar1 = *(uint *)(fn._0_8_ + uVar22 * 4);
            if (puVar19[uVar22] != uVar1) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                      ,0x222,
                      "# components of stream %u in -mllrmat inconsistent w/ -feat config (%u != %u)\n"
                      ,uVar22,(ulong)uVar1,(ulong)puVar19[uVar22]);
              goto LAB_0010c393;
            }
            uVar22 = uVar22 + 1;
          } while (tmp_n_stream != uVar22);
        }
        ckd_free((void *)fn._0_8_);
        pcVar12 = cmd_ln_get();
        pcVar14 = cmd_ln_str_r(pcVar12,"-cb2mllrfn");
        if (pcVar14 != (char *)0x0) {
          iVar10 = strcmp(pcVar14,".1cls.");
          if (iVar10 == 0) {
            mllr_idx = (int32 *)__ckd_calloc__((ulong)((model_inventory_t *)pcVar13)->gauden->n_mgau
                                               ,4,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                               ,0x22a);
            n_mllr = 1;
            n_map = ((model_inventory_t *)pcVar13)->gauden->n_mgau;
          }
          else {
            pcVar12 = cmd_ln_get();
            pcVar14 = cmd_ln_str_r(pcVar12,"-cb2mllrfn");
            iVar10 = s3cb2mllr_read(pcVar14,&mllr_idx,&n_map,&n_mllr);
            if (iVar10 != 0) goto LAB_0010b8dc;
          }
          if (n_map != ((model_inventory_t *)pcVar13)->gauden->n_mgau) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                    ,0x236,"cb2mllr maps %u cb, but read %u cb from files\n");
            goto LAB_0010c393;
          }
        }
        pgVar5 = ((model_inventory_t *)pcVar13)->gauden;
        mllr_transform_mean(pgVar5->mean,pgVar5->var,0,pgVar5->n_mgau,pgVar5->n_feat,
                            pgVar5->n_density,pgVar5->veclen,sxfrm_a,sxfrm_b,mllr_idx,n_mllr);
        ckd_free(mllr_idx);
        free_mllr_A(sxfrm_a,n_mllr,tmp_n_stream);
        free_mllr_B(sxfrm_b,n_mllr,tmp_n_stream);
        goto LAB_0010b8df;
      }
      pcVar13 = "# feature streams in -mllrmat %s != # feature streams configured on cmd ln\n";
      lVar15 = 0x21a;
    }
    else {
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-accumdir");
      sprintf(fn,"%s/ckpt",pcVar14);
      __stream = fopen(fn,"r");
      if (__stream == (FILE *)0x0) goto LAB_0010c022;
      fclose(__stream);
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-accumdir");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x1e6,"RESTORING CHECKPOINTED COUNTS IN %s\n",pcVar14);
      if (feat->lda == (mfcc_t ***)0x0) {
        puVar19 = feat->sv_len;
        if (puVar19 == (uint32 *)0x0) {
          puVar19 = feat->stream_len;
        }
      }
      else {
        puVar19 = &feat->out_dim;
      }
      pcVar12 = cmd_ln_get();
      pcVar14 = cmd_ln_str_r(pcVar12,"-accumdir");
      iVar10 = mod_inv_restore_acc((model_inventory_t *)pcVar13,pcVar14,(int)local_1080,
                                   (int)local_1078,(int)local_10a0,(int)local_1048,puVar19);
      if (iVar10 == 0) {
        iVar10 = corpus_ckpt_set_interval(fn);
        if (iVar10 != 0) {
          pcVar13 = "Unable to restore corpus state information\n";
          lVar15 = 0x1f5;
          goto LAB_0010c387;
        }
        uVar11 = corpus_get_begin();
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x1f8,"Resuming at utt %u\n",(ulong)uVar11);
        goto LAB_0010c18e;
      }
      pcVar13 = "Unable to restore checkpoint information\n";
      lVar15 = 0x1f1;
    }
  }
  else {
    pcVar12 = cmd_ln_get();
    pcVar13 = cmd_ln_str_r(pcVar12,"-lda");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0xd9,"Reading linear feature transformation from %s\n",pcVar13);
    pcVar12 = cmd_ln_get();
    pcVar13 = cmd_ln_str_r(pcVar12,"-lda");
    pcVar12 = cmd_ln_get();
    lVar15 = cmd_ln_int_r(pcVar12,"-ldadim");
    iVar9 = feat_read_lda(feat,pcVar13,(int32)lVar15);
    if (-1 < iVar9) goto LAB_0010b391;
LAB_0010b73e:
    bVar8 = false;
    prior_lex = (lexicon_t *)0x0;
    mdef_01 = (model_def_t *)0x0;
LAB_0010b8df:
    if (bVar8) {
      pcVar12 = cmd_ln_get();
      lVar15 = cmd_ln_int_r(pcVar12,"-mmie");
      if ((int)lVar15 == 0) {
        pcVar12 = cmd_ln_get();
        lVar15 = cmd_ln_int_r(pcVar12,"-viterbi");
        main_reestimate((model_inventory_t *)pcVar13,prior_lex,mdef_01,feat,(int32)lVar15);
      }
      else {
        main_mmi_reestimate((model_inventory_t *)pcVar13,prior_lex,mdef_01,feat);
      }
      if (feat != (feat_t *)0x0) {
        feat_free(feat);
      }
      if (mdef_01 != (model_def_t *)0x0) {
        model_def_free(mdef_01);
      }
      if ((model_inventory_t *)pcVar13 != (model_inventory_t *)0x0) {
        mod_inv_free((model_inventory_t *)pcVar13);
      }
      if (prior_lex != (lexicon_t *)0x0) {
        lexicon_free(prior_lex);
      }
      return 0;
    }
    pcVar13 = "initialization failed\n";
    lVar15 = 0x714;
  }
LAB_0010c387:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
          ,lVar15,pcVar13);
LAB_0010c393:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    model_inventory_t *inv;
    lexicon_t *lex = NULL;
    model_def_t *mdef = NULL;
    feat_t *feat = NULL;
    
    if (main_initialize(argc, argv,
			&inv, &lex, &mdef, &feat) != S3_SUCCESS) {
	E_FATAL("initialization failed\n");
    }

    if (cmd_ln_int32("-mmie")) {
      main_mmi_reestimate(inv, lex, mdef, feat);
    }
    else {
      main_reestimate(inv, lex, mdef, feat, cmd_ln_int32("-viterbi"));
    }
    
    if (feat)
	feat_free(feat);
    if (mdef)
	model_def_free(mdef);    
    if (inv)
	mod_inv_free(inv);
    if (lex)
	lexicon_free(lex);

    return 0;
}